

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

SUNErrCode SUNMatCopy_Sparse(SUNMatrix A,SUNMatrix B)

{
  long lVar1;
  void *pvVar2;
  SUNMatrix in_RSI;
  long *in_RDI;
  SUNContext_conflict sunctx_local_scope_;
  sunindextype A_nz;
  sunindextype i;
  long local_18;
  
  lVar1 = *(long *)(*(long *)(*in_RDI + 0x38) + *(long *)(*in_RDI + 0x18) * 8);
  if (*(long *)((long)in_RSI->content + 0x10) < lVar1) {
    pvVar2 = realloc(*(void **)((long)in_RSI->content + 0x30),lVar1 << 3);
    *(void **)((long)in_RSI->content + 0x30) = pvVar2;
    pvVar2 = realloc(*(void **)((long)in_RSI->content + 0x20),lVar1 << 3);
    *(void **)((long)in_RSI->content + 0x20) = pvVar2;
    *(long *)((long)in_RSI->content + 0x10) = lVar1;
  }
  SUNMatZero_Sparse(in_RSI);
  for (local_18 = 0; local_18 < lVar1; local_18 = local_18 + 1) {
    *(undefined8 *)(*(long *)((long)in_RSI->content + 0x20) + local_18 * 8) =
         *(undefined8 *)(*(long *)(*in_RDI + 0x20) + local_18 * 8);
    *(undefined8 *)(*(long *)((long)in_RSI->content + 0x30) + local_18 * 8) =
         *(undefined8 *)(*(long *)(*in_RDI + 0x30) + local_18 * 8);
  }
  for (local_18 = 0; local_18 < *(long *)(*in_RDI + 0x18); local_18 = local_18 + 1) {
    *(undefined8 *)(*(long *)((long)in_RSI->content + 0x38) + local_18 * 8) =
         *(undefined8 *)(*(long *)(*in_RDI + 0x38) + local_18 * 8);
  }
  *(long *)(*(long *)((long)in_RSI->content + 0x38) + *(long *)(*in_RDI + 0x18) * 8) = lVar1;
  return 0;
}

Assistant:

SUNErrCode SUNMatCopy_Sparse(SUNMatrix A, SUNMatrix B)
{
  sunindextype i, A_nz;
  SUNFunctionBegin(A->sunctx);

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(SUNMatGetID(B) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrices(A, B), SUN_ERR_ARG_DIMSMISMATCH);

  /* Perform operation */
  A_nz = (SM_INDEXPTRS_S(A))[SM_NP_S(A)];

  /* ensure that B is allocated with at least as
     much memory as we have nonzeros in A */
  if (SM_NNZ_S(B) < A_nz)
  {
    SM_INDEXVALS_S(B) = (sunindextype*)realloc(SM_INDEXVALS_S(B),
                                               A_nz * sizeof(sunindextype));
    SUNAssert(SM_INDEXVALS_S(B), SUN_ERR_MALLOC_FAIL);

    SM_DATA_S(B) = (sunrealtype*)realloc(SM_DATA_S(B),
                                         A_nz * sizeof(sunrealtype));
    SUNAssert(SM_DATA_S(B), SUN_ERR_MALLOC_FAIL);

    SM_NNZ_S(B) = A_nz;
  }

  /* zero out B so that copy works correctly */
  SUNCheckCall(SUNMatZero_Sparse(B));

  /* copy the data and row indices over */
  for (i = 0; i < A_nz; i++)
  {
    (SM_DATA_S(B))[i]      = (SM_DATA_S(A))[i];
    (SM_INDEXVALS_S(B))[i] = (SM_INDEXVALS_S(A))[i];
  }

  /* copy the column pointers over */
  for (i = 0; i < SM_NP_S(A); i++)
  {
    (SM_INDEXPTRS_S(B))[i] = (SM_INDEXPTRS_S(A))[i];
  }
  (SM_INDEXPTRS_S(B))[SM_NP_S(A)] = A_nz;

  return SUN_SUCCESS;
}